

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.cpp
# Opt level: O3

error_or_n<const_gsl::span<std::uint8_t>_> *
pstore::http::details::decode_payload
          (error_or_n<const_gsl::span<std::uint8_t>_> *__return_storage_ptr__,
          uint64_t expected_length,span<const_unsigned_char,__1L> *mask,
          span<unsigned_char,__1L> *payload)

{
  byte *pbVar1;
  long value;
  pointer peVar2;
  unsigned_long uVar3;
  long lVar4;
  tuple<pstore::gsl::span<unsigned_char,__1L>_> *ptVar5;
  error_code *peVar6;
  ulong uVar7;
  error_code eVar8;
  error_or<std::tuple<pstore::gsl::span<unsigned_char,__1L>_>_> eStack_48;
  
  value = (payload->storage_).super_extent_type<_1L>.size_;
  if ((value < 0) ||
     (uVar3 = unsigned_cast<long,unsigned_long,void>(value), uVar3 != expected_length)) {
    eStack_48.has_error_ = true;
    peVar6 = error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>>>::
             error_storage_impl<pstore::error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>>>&,std::error_code>
                       (&eStack_48);
    eVar8 = make_error_code(insufficient_data);
    peVar6->_M_value = eVar8._M_value;
    peVar6->_M_cat = eVar8._M_cat;
    __return_storage_ptr__->has_error_ = true;
    error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>const>>::
    move_construct<std::tuple<pstore::gsl::span<unsigned_char,_1l>>>
              ((error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>const>> *)
               __return_storage_ptr__,&eStack_48);
  }
  else {
    if (value != 0) {
      lVar4 = 0;
      do {
        uVar7 = (ulong)((uint)lVar4 & 3);
        if (((mask->storage_).super_extent_type<_1L>.size_ <= (long)uVar7) ||
           ((payload->storage_).super_extent_type<_1L>.size_ <= lVar4)) {
          assert_failed("idx >= 0 && idx < storage_.size ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                        ,0x18a);
        }
        pbVar1 = (payload->storage_).data_ + lVar4;
        *pbVar1 = *pbVar1 ^ (mask->storage_).data_[uVar7];
        lVar4 = lVar4 + 1;
      } while (value != lVar4);
    }
    eStack_48.has_error_ = false;
    ptVar5 = error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>>>::
             value_storage_impl<pstore::error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>>>&,std::tuple<pstore::gsl::span<unsigned_char,_1l>>>
                       (&eStack_48);
    peVar2 = (payload->storage_).data_;
    (ptVar5->super__Tuple_impl<0UL,_pstore::gsl::span<unsigned_char,__1L>_>).
    super__Head_base<0UL,_pstore::gsl::span<unsigned_char,__1L>,_false>._M_head_impl.storage_.
    super_extent_type<_1L>.size_ = (payload->storage_).super_extent_type<_1L>.size_;
    (ptVar5->super__Tuple_impl<0UL,_pstore::gsl::span<unsigned_char,__1L>_>).
    super__Head_base<0UL,_pstore::gsl::span<unsigned_char,__1L>,_false>._M_head_impl.storage_.data_
         = peVar2;
    __return_storage_ptr__->has_error_ = true;
    error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>const>>::
    move_construct<std::tuple<pstore::gsl::span<unsigned_char,_1l>>>
              ((error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>const>> *)
               __return_storage_ptr__,&eStack_48);
  }
  if (eStack_48.has_error_ == false) {
    error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>>>::
    value_storage_impl<pstore::error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>>>&,std::tuple<pstore::gsl::span<unsigned_char,_1l>>>
              (&eStack_48);
  }
  else {
    error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>>>::
    error_storage_impl<pstore::error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>>>&,std::error_code>
              (&eStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

error_or_n<gsl::span<std::uint8_t> const>
        details::decode_payload (std::uint64_t const expected_length,
                                 gsl::span<std::uint8_t const> const & mask,
                                 gsl::span<std::uint8_t> const & payload) {
            using return_type = error_or_n<gsl::span<std::uint8_t>>;
            auto const size = payload.size ();
            if (size < 0 || unsigned_cast (size) != expected_length) {
                return return_type{ws_error::insufficient_data};
            }

            // "Octet i of the transformed data ("transformed-octet-i") is the XOR of octet i of
            // the original data ("original-octet-i") with octet at index i modulo 4 of the
            // masking key ("masking-key-octet-j"):
            //     j                   = i MOD 4
            //     transformed-octet-i = original-octet-i XOR masking-key-octet-j"

            for (auto ctr = gsl::span<std::uint8_t>::index_type{0}; ctr < size; ++ctr) {
                payload[ctr] ^= mask[ctr % 4];
            }
            return return_type{in_place, payload};
        }